

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O1

void voc_parse_np(voccxdef *ctx)

{
  short *psVar1;
  vocoldef *pvVar2;
  ushort uVar3;
  runsdef *prVar4;
  voccxdef *pvVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int32_t tmp;
  char **ppcVar9;
  long lVar10;
  uint32_t tmp_6;
  uint uVar11;
  ulong __n;
  ushort *puVar12;
  ulong uVar13;
  int iVar14;
  char **ppcVar15;
  char **ppcVar16;
  errcxdef *ctx_00;
  int32_t tmp_2;
  int32_t tmp_1;
  long lVar17;
  vocoldef *pvVar18;
  uchar *puVar19;
  vocoldef *pvVar20;
  uint uVar21;
  int iVar22;
  char **cmd;
  uint16_t tmp_3;
  ushort *local_b0;
  uint local_a4;
  int next;
  uint local_9c;
  voccxdef *local_98;
  vocoldef *local_90;
  int local_88;
  int local_84;
  ushort *local_80;
  runcxdef *local_78;
  char **local_70;
  undefined8 local_68;
  undefined8 local_60;
  char **local_58;
  int no_match;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pvVar20 = (vocoldef *)ctx->voc_stk_cur;
  if ((vocoldef *)ctx->voc_stk_end < pvVar20 + 200) {
    ctx_00 = ctx->voccxerr;
  }
  else {
    local_78 = ctx->voccxrun;
    ctx->voc_stk_cur = (uchar *)(pvVar20 + 200);
    local_48._0_4_ = ctx->voccxunknown;
    local_48._4_4_ = ctx->voccxlastunk;
    uStack_40 = 0;
    ctx->voccxunknown = 0;
    ctx->voccxlastunk = 0;
    prVar4 = local_78->runcxsp;
    local_78->runcxsp = prVar4 + -1;
    if (prVar4[-1].runstyp != '\a') {
LAB_001f83b7:
      local_78->runcxerr->errcxptr->erraac = 0;
      runsign(local_78,0x3fc);
    }
    puVar12 = (ushort *)prVar4[-1].runsv.runsvstr;
    uVar3 = *puVar12;
    local_78->runcxsp = prVar4 + -2;
    if (prVar4[-2].runstyp != '\a') goto LAB_001f83b7;
    local_80 = (ushort *)prVar4[-2].runsv.runsvstr;
    local_9c = (uint)*local_80;
    local_78->runcxsp = prVar4 + -3;
    if (prVar4[-3].runstyp != '\x01') {
      local_78->runcxerr->errcxptr->erraac = 0;
      runsign(local_78,0x3eb);
    }
    next = *(int *)&prVar4[-3].runsv + -1;
    local_78->runcxsp = prVar4 + -4;
    if (prVar4[-4].runstyp == '\x05') {
      local_88 = 0;
    }
    else {
      local_88 = 1;
      if (prVar4[-4].runstyp != '\b') goto LAB_001f7f20;
    }
    local_78->runcxsp = prVar4 + -5;
    if (prVar4[-5].runstyp == '\x05') {
      local_60 = 0;
    }
    else {
      local_60 = 1;
      if (prVar4[-5].runstyp != '\b') goto LAB_001f7f20;
    }
    local_78->runcxsp = prVar4 + -6;
    if (prVar4[-6].runstyp == '\x05') {
      local_68 = 0;
    }
    else {
      local_68 = 1;
      if (prVar4[-6].runstyp != '\b') {
LAB_001f7f20:
        local_78->runcxerr->errcxptr->erraac = 0;
        runsign(local_78,0x3ed);
      }
    }
    uVar11 = uVar3 - 2;
    puVar12 = puVar12 + 1;
    local_a4 = uVar11;
    local_b0 = puVar12;
    local_98 = ctx;
    local_90 = pvVar20;
    local_84 = next;
    if (uVar11 == 0) {
      uVar13 = 0;
      uVar21 = 0;
    }
    else {
      uVar21 = 0;
      iVar22 = 0;
      do {
        if ((char)*local_b0 == '\x03') {
          iVar22 = iVar22 + (uint)*(ushort *)((long)local_b0 + 1) + 1;
        }
        lstadv((uchar **)&local_b0,&local_a4);
        uVar21 = uVar21 + 1;
      } while (local_a4 != 0);
      uVar13 = (ulong)(iVar22 + 7U & 0xfffffff8);
    }
    puVar19 = local_98->voc_stk_cur;
    ppcVar16 = (char **)local_98->voc_stk_end;
    cmd = (char **)(puVar19 + uVar13);
    if (cmd <= ppcVar16) {
      local_98->voc_stk_cur = (uchar *)cmd;
      ppcVar15 = (char **)((ulong)(uVar21 * 8 + 8) + (long)cmd);
      if (ppcVar15 <= ppcVar16) {
        local_98->voc_stk_cur = (uchar *)ppcVar15;
        ppcVar9 = (char **)((ulong)((uVar21 + 1) * 4 + 7 & 0xfffffff8) + (long)ppcVar15);
        local_70 = ppcVar15;
        if (ppcVar9 <= ppcVar16) {
          local_80 = local_80 + 1;
          local_98->voc_stk_cur = (uchar *)ppcVar9;
          uVar13 = 0;
          local_a4 = local_9c - 2;
          if (uVar11 != 0) {
            local_b0 = puVar12;
            local_a4 = uVar11;
            local_9c = local_9c - 2;
            local_58 = cmd;
            do {
              if ((char)*local_b0 == '\x03') {
                cmd[(int)uVar13] = (char *)puVar19;
                uVar3 = *(ushort *)((long)local_b0 + 1);
                __n = (ulong)(uVar3 - 2);
                memcpy(puVar19,(char *)((long)local_b0 + 3),__n);
                puVar19[__n] = '\0';
                puVar19 = puVar19 + (uVar3 - 1);
                uVar13 = (ulong)((int)uVar13 + 1);
                cmd = local_58;
              }
              lstadv((uchar **)&local_b0,&local_a4);
            } while (local_a4 != 0);
            uVar13 = (ulong)(int)uVar13;
            local_a4 = local_9c;
          }
          ppcVar16 = local_70;
          cmd[uVar13] = (char *)0x0;
          local_b0 = local_80;
          if (0 < (int)uVar21 && local_a4 != 0) {
            iVar22 = 0;
            do {
              if ((char)*local_b0 == '\x01') {
                *(undefined4 *)((long)ppcVar16 + (long)iVar22 * 4) =
                     *(undefined4 *)((long)local_b0 + 1);
                iVar22 = iVar22 + 1;
              }
              lstadv((uchar **)&local_b0,&local_a4);
            } while ((local_a4 != 0) && (iVar22 < (int)uVar21));
          }
          pvVar20 = local_90;
          pvVar5 = local_98;
          uVar7 = vocgobj(local_98,cmd,(int *)ppcVar16,local_84,&next,local_88,local_90,
                          (int)local_60,(int)local_68,&no_match);
          pvVar5->voccxunknown = (undefined4)local_48;
          pvVar5->voccxlastunk = local_48._4_4_;
          if ((int)uVar7 < 0) {
            runpnil(local_78);
          }
          else if (uVar7 == 0) {
            iVar22 = next + 1;
            next = iVar22;
            puVar19 = voc_push_list_siz(local_98,5);
            *puVar19 = '\x01';
            *(int *)(puVar19 + 1) = iVar22;
          }
          else {
            uVar8 = 0;
            iVar22 = 0;
            do {
              iVar14 = iVar22;
              lVar10 = (long)(int)uVar8;
              ppcVar15 = &pvVar20[lVar10].vocolfst;
              uVar8 = uVar8 + 1;
              ppcVar16 = ppcVar15;
              if ((int)uVar8 < (int)uVar7) {
                uVar8 = uVar7;
              }
              do {
                if (*ppcVar16 != *ppcVar15) {
                  uVar8 = (uint)lVar10;
                  break;
                }
                iVar14 = iVar14 + (uint)(((vocoldef *)(ppcVar16 + -1))->vocolobj != 0xffff) * 2 + 6;
                lVar10 = lVar10 + 1;
                ppcVar16 = ppcVar16 + 5;
              } while (lVar10 < (long)(ulong)uVar7);
              iVar22 = iVar14 + 0xd;
            } while ((int)uVar8 < (int)uVar7);
            local_a4 = iVar14 + 0x12;
            puVar19 = voc_push_list_siz(local_98,local_a4);
            *puVar19 = '\x01';
            *(int *)(puVar19 + 1) = next + 1;
            local_b0 = (ushort *)(puVar19 + 5);
            uVar8 = 0;
            do {
              psVar1 = (short *)((long)local_b0 + 1);
              *(uchar *)local_b0 = '\a';
              lVar10 = (long)(int)uVar8;
              if (uVar21 == 0) {
                iVar14 = -1;
                iVar22 = 0;
              }
              else {
                iVar14 = -1;
                uVar13 = 0;
                do {
                  iVar22 = (int)uVar13;
                  if (cmd[uVar13] != pvVar20[lVar10].vocolfst) {
                    iVar22 = iVar14;
                  }
                  iVar14 = iVar22;
                  if (cmd[uVar13] == pvVar20[lVar10].vocollst) {
                    iVar22 = (int)uVar13 + 1;
                    pvVar20 = local_90;
                    goto LAB_001f8293;
                  }
                  uVar13 = uVar13 + 1;
                } while (uVar21 != uVar13);
                iVar22 = 0;
                pvVar20 = local_90;
              }
LAB_001f8293:
              *(uchar *)((long)local_b0 + 3) = '\x01';
              *(int *)(local_b0 + 2) = iVar14 + 1;
              *(uchar *)(local_b0 + 4) = '\x01';
              *(int *)((long)local_b0 + 9) = iVar22;
              local_b0 = (ushort *)((long)local_b0 + 0xd);
              uVar6 = uVar8;
              if ((int)uVar8 < (int)uVar7) {
                pvVar2 = pvVar20 + lVar10;
                lVar17 = 0;
                pvVar18 = pvVar2;
                do {
                  if (pvVar18->vocolfst != pvVar2->vocolfst) {
                    uVar6 = uVar8 - (int)lVar17;
                    break;
                  }
                  if (pvVar18->vocolobj == 0xffff) {
                    *(uchar *)local_b0 = '\x05';
                    local_b0 = (objnum *)((long)local_b0 + 1);
                  }
                  else {
                    *(uchar *)local_b0 = '\x02';
                    *(objnum *)((long)local_b0 + 1) = pvVar18->vocolobj;
                    local_b0 = (objnum *)((long)local_b0 + 3);
                  }
                  *(uchar *)local_b0 = '\x01';
                  *(int *)((long)local_b0 + 1) = pvVar2->vocolflg;
                  local_b0 = (ushort *)((long)local_b0 + 5);
                  lVar17 = lVar17 + -1;
                  pvVar18 = pvVar18 + 1;
                  uVar6 = uVar7;
                } while (lVar10 - (ulong)uVar7 != lVar17);
              }
              uVar8 = uVar6;
              *psVar1 = (short)local_b0 - (short)psVar1;
            } while ((int)uVar8 < (int)uVar7);
          }
          local_98->voc_stk_cur = (uchar *)pvVar20;
          return;
        }
      }
    }
    ctx_00 = local_98->voccxerr;
  }
  errsigf(ctx_00,"TADS",0x417);
}

Assistant:

void voc_parse_np(voccxdef *ctx)
{
    runcxdef *rcx = ctx->voccxrun;
    vocoldef *objlist;
    uchar *save_sp;
    uchar *wordp;
    uint wordsiz;
    uchar *typp;
    uint typsiz;
    int cnt;
    char **wordarr;
    int wordcnt;
    char *wordchararr;
    uint wordcharsiz;
    int *typarr;
    int complain;
    int chkact;
    int multi;
    int no_match;
    int next;
    int cur;
    uchar *lstp;
    uint lstsiz;
    char *p;
    int i;
    int old_unknown, old_lastunk;

    /* allocate stack arrays */
    voc_enter(ctx, &save_sp);
    VOC_MAX_ARRAY(ctx, vocoldef, objlist);

    /* 
     *   Save the original context unknown values, since we don't want to
     *   affect the context information in this game-initiated call, then
     *   clear the unknown word count for the duration of the call.  
     */
    old_unknown = ctx->voccxunknown;
    old_lastunk = ctx->voccxlastunk;
    ctx->voccxunknown = ctx->voccxlastunk = 0;

    /* get the list of words, and read its length prefix */
    wordp = runpoplst(rcx);
    wordsiz = osrp2(wordp) - 2;
    wordp += 2;

    /* get the list of types, and read its length prefix */
    typp = runpoplst(rcx);
    typsiz = osrp2(typp) - 2;
    typp += 2;

    /* get the starting index (adjusting for zero-based indexing) */
    cur = runpopnum(rcx) - 1;
    next = cur;

    /* get the flag arguments */
    complain = runpoplog(rcx);
    multi = runpoplog(rcx);
    chkact = runpoplog(rcx);

    /* count the words in the word list */
    for (wordcnt = 0, lstp = wordp, wordcharsiz = 0, lstsiz = wordsiz ;
         lstsiz != 0 ; lstadv(&lstp, &lstsiz))
    {
        /* count the word */
        ++wordcnt;

        /* 
         *   count the space needed for the word - count the bytes of the
         *   string plus a null terminator 
         */
        if (*lstp == DAT_SSTRING)
            wordcharsiz += osrp2(lstp+1) + 1;
    }

    /* allocate space for the word arrays */
    VOC_STK_ARRAY(ctx, char,   wordchararr, wordcharsiz);
    VOC_STK_ARRAY(ctx, char *, wordarr,     wordcnt+1);
    VOC_STK_ARRAY(ctx, int,    typarr,      wordcnt+1);

    /* build the word array */
    for (i = 0, p = wordchararr, lstp = wordp, lstsiz = wordsiz ;
         lstsiz != 0 ; lstadv(&lstp, &lstsiz))
    {
        /* add the word to the word array */
        if (*lstp == DAT_SSTRING)
        {
            uint len;
            
            /* add this entry to the word array */
            wordarr[i] = p;

            /* copy the word to the character array and null-terminate it */
            len = osrp2(lstp + 1) - 2;
            memcpy(p, lstp + 3, len);
            p[len] = '\0';

            /* move the write pointer past this entry */
            p += len + 1;

            /* bump the index */
            ++i;
        }
    }

    /* store an empty last entry */
    wordarr[i] = 0;

    /* build the type array */
    for (i = 0, lstp = typp, lstsiz = typsiz ;
         lstsiz != 0 && i < wordcnt ; lstadv(&lstp, &lstsiz))
    {
        /* add this entry to the type array */
        if (*lstp == DAT_NUMBER)
        {
            /* set the entry */
            typarr[i] = (int)osrp4(lstp + 1);

            /* bump the index */
            ++i;
        }
    }

    /* parse the noun phrase */
    cnt = vocgobj(ctx, wordarr, typarr, cur, &next, complain, objlist,
                  multi, chkact, &no_match);

    /* restore context unknown values */
    ctx->voccxunknown = old_unknown;
    ctx->voccxlastunk = old_lastunk;

    /* check the return value */
    if (cnt < 0)
    {
        /* syntax error; return nil to indicate an error */
        runpnil(rcx);
    }
    else if (cnt == 0)
    {
        /* 
         *   No objects found.  Return a list consisting only of the next
         *   index.  If the next index is equal to the starting index,
         *   this will tell the caller that no noun phrase is
         *   syntactically present; otherwise, it will tell the caller
         *   that a noun phrase is present but there are no matching
         *   objects.
         *   
         *   Note that we must increment the returned element index to
         *   conform with the 1-based index values that the game function
         *   uses.  
         */
        ++next;
        voc_push_numlist(ctx, (uint *)&next, 1);
    }
    else
    {
        /*
         *   We found one or more objects.  Return a list whose first
         *   element is the index of the next word to be parsed, and whose
         *   remaining elements are sublists.  Each sublist contains a
         *   match for one noun phrase; for each AND adding another noun
         *   phrase, there's another sublist.  Each sublist contains the
         *   index of the first word of its noun phrase, the index of the
         *   last word of its noun phrase, and then the objects.  For each
         *   object, there is a pair of entries: the object itself, and
         *   the flags for the object.
         *   
         *   First, figure out how much space we need by scanning the
         *   return list.  
         */
        for (lstsiz = 0, i = 0 ; i < cnt ; )
        {
            int j;

            /* 
             *   count the entries in this sublist by looking for the next
             *   entry whose starting word is different 
             */
            for (j = i ;
                 j < cnt && objlist[j].vocolfst == objlist[i].vocolfst ;
                 ++j)
            {
                /* 
                 *   for this entry, we need space for the object (1 + 2
                 *   for an object, or just 1 for nil) and flags (1 + 4) 
                 */
                if (objlist[j].vocolobj == MCMONINV)
                    lstsiz += 1;
                else
                    lstsiz += 3;
                lstsiz += 5;
            }

            /* 
             *   For this sublist, we need space for the first index (type
             *   prefix + number = 1 + 4 = 5) and the last index (5).
             *   We've already counted space for the objects in the list.
             *   Finally, we need space for the list type and length
             *   prefixes (1 + 2) for the sublist itself.  
             */
            lstsiz += (5 + 5) + 3;

            /* skip to the next element */
            i = j;
        }

        /* 
         *   finally, we need space for the first element of the list,
         *   which is the index of the next word to be parsed (1+4)
         */
        lstsiz += 5;

        /* allocate space for the list */
        lstp = voc_push_list_siz(ctx, lstsiz);

        /* 
         *   store the first element - the index of the next word to parse
         *   (adjusting to 1-based indexing) 
         */
        *lstp++ = DAT_NUMBER;
        oswp4s(lstp, next + 1);
        lstp += 4;

        /* build the list */
        for (i = 0 ; i < cnt ; )
        {
            uchar *sublstp;
            int j;
            int firstidx = -1;
            int lastidx = -1;

            /* store the list type prefix */
            *lstp++ = DAT_LIST;

            /* 
             *   remember where the length prefix is, then skip it - we'll
             *   come back and fill it in when we're done with the sublist 
             */
            sublstp = lstp;
            lstp += 2;

            /* search the array to find the indices of the boundary words */
            for (j = 0 ; j < wordcnt ; ++j)
            {
                /* if this is the first word, remember the index */
                if (wordarr[j] == objlist[i].vocolfst)
                    firstidx = j;

                /* if this is the last word, remember the index */
                if (wordarr[j] == objlist[i].vocollst)
                {
                    /* remember the index */
                    lastidx = j;

                    /* 
                     *   we can stop looking now, since the words are
                     *   always in order (so the first index will never be
                     *   after the last index) 
                     */
                    break;
                }
            }

            /* add the first and last index, adjusting to 1-based indexing */
            *lstp++ = DAT_NUMBER;
            oswp4s(lstp, firstidx + 1);
            lstp += 4;
            *lstp++ = DAT_NUMBER;
            oswp4s(lstp, lastidx + 1);
            lstp += 4;

            /* add the objects */
            for (j = i ; 
                 j < cnt && objlist[j].vocolfst == objlist[i].vocolfst ;
                 ++j)
            {
                /* add this object */
                if (objlist[j].vocolobj == MCMONINV)
                {
                    /* just store a nil */
                    *lstp++ = DAT_NIL;
                }
                else
                {
                    /* store the object */
                    *lstp++ = DAT_OBJECT;
                    oswp2(lstp, objlist[j].vocolobj);
                    lstp += 2;
                }

                /* add the flags */
                *lstp++ = DAT_NUMBER;
                oswp4s(lstp, objlist[i].vocolflg);
                lstp += 4;
            }

            /* fix up the sublist's length prefix */
            oswp2(sublstp, lstp - sublstp);

            /* move on to the next sublist */
            i = j;
        }
    }

    /* exit the stack frame */
    voc_leave(ctx, save_sp);
}